

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

void __thiscall TTD::TTDebuggerSourceLocation::Initialize(TTDebuggerSourceLocation *this)

{
  this->m_sourceScriptLogId = 0;
  *(undefined4 *)&this->m_bpId = 0xffffffff;
  *(undefined4 *)((long)&this->m_bpId + 4) = 0xffffffff;
  *(undefined4 *)&this->m_etime = 0xffffffff;
  *(undefined4 *)((long)&this->m_etime + 4) = 0xffffffff;
  this->m_ftime = 0;
  this->m_ltime = 0;
  this->m_topLevelBodyId = 0;
  this->m_functionLine = 0;
  this->m_functionColumn = 0;
  this->m_line = 0;
  this->m_column = 0;
  return;
}

Assistant:

void TTDebuggerSourceLocation::Initialize()
    {
        this->m_sourceScriptLogId = TTD_INVALID_LOG_PTR_ID;
        this->m_bpId = -1;

        this->m_etime = -1;
        this->m_ftime = 0;
        this->m_ltime = 0;

        this->m_topLevelBodyId = 0;

        this->m_functionLine = 0;
        this->m_functionColumn = 0;
        this->m_line = 0;
        this->m_column = 0;
    }